

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c140.c
# Opt level: O3

void c140_alloc_rom(void *chip,UINT32 memsize)

{
  void *__s;
  uint uVar1;
  c140_state *info;
  
  if (*(UINT32 *)((long)chip + 0x18) == memsize) {
    return;
  }
  __s = realloc(*(void **)((long)chip + 0x20),(ulong)memsize);
  *(void **)((long)chip + 0x20) = __s;
  *(UINT32 *)((long)chip + 0x18) = memsize;
  if (memsize == 0) {
    uVar1 = 0;
  }
  else {
    uVar1 = memsize - 1 >> 1 | memsize - 1;
    uVar1 = uVar1 >> 2 | uVar1;
    uVar1 = uVar1 >> 4 | uVar1;
    uVar1 = uVar1 >> 8 | uVar1;
    uVar1 = uVar1 >> 0x10 | uVar1;
  }
  *(uint *)((long)chip + 0x1c) = uVar1;
  memset(__s,0xff,(ulong)memsize);
  return;
}

Assistant:

static void c140_alloc_rom(void* chip, UINT32 memsize)
{
	c140_state *info = (c140_state *)chip;
	
	if (info->romSize == memsize)
		return;
	
	info->pRom = (UINT8*)realloc(info->pRom, memsize);
	info->romSize = memsize;
	info->romMask = pow2_mask(memsize);
	memset(info->pRom, 0xFF, memsize);
	
	return;
}